

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O3

tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
* generate_list<trng::lcg64_count_shift>
            (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             *__return_storage_ptr__,lcg64_count_shift *r1,lcg64_count_shift *r2,long N,long skip1,
            long skip2)

{
  result_type rVar1;
  result_type rVar2;
  ulong uVar3;
  long lVar4;
  long i;
  long lVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> v1;
  ulong local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  *local_48;
  long local_40;
  long local_38;
  
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_48 = (_Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)__return_storage_ptr__;
  local_40 = N;
  local_38 = skip2;
  if (0 < N) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_68,N);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&local_88,N);
    lVar5 = 0;
    do {
      rVar1 = (r1->S).r * (r1->P).a + (r1->P).b;
      (r1->S).r = rVar1;
      uVar3 = (r1->S).count + (r1->P).inc;
      local_90 = uVar3 + 0xe000000000000001;
      if (uVar3 < 0x1fffffffffffffff) {
        local_90 = uVar3;
      }
      (r1->S).count = local_90;
      local_90 = local_90 + rVar1;
      local_90 = local_90 >> 0x11 ^ local_90;
      local_90 = local_90 << 0x1f ^ local_90;
      local_90 = local_90 >> 8 ^ local_90;
      if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_90);
      }
      else {
        *local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_90;
        local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      rVar1 = (r2->S).r * (r2->P).a + (r2->P).b;
      (r2->S).r = rVar1;
      uVar3 = (r2->S).count + (r2->P).inc;
      local_90 = uVar3 + 0xe000000000000001;
      if (uVar3 < 0x1fffffffffffffff) {
        local_90 = uVar3;
      }
      (r2->S).count = local_90;
      local_90 = local_90 + rVar1;
      local_90 = local_90 >> 0x11 ^ local_90;
      local_90 = local_90 << 0x1f ^ local_90;
      local_90 = local_90 >> 8 ^ local_90;
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
                  (&local_88,
                   (iterator)
                   local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&local_90);
      }
      else {
        *local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish = local_90;
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if (0 < skip1) {
        rVar1 = (r1->S).count;
        rVar2 = (r1->S).r;
        lVar4 = skip1;
        do {
          uVar3 = rVar1 + (r1->P).inc;
          rVar2 = rVar2 * (r1->P).a + (r1->P).b;
          rVar1 = uVar3 + 0xe000000000000001;
          if (uVar3 < 0x1fffffffffffffff) {
            rVar1 = uVar3;
          }
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        (r1->S).r = rVar2;
        (r1->S).count = rVar1;
      }
      if (0 < local_38) {
        rVar1 = (r2->S).count;
        rVar2 = (r2->S).r;
        lVar4 = local_38;
        do {
          uVar3 = rVar1 + (r2->P).inc;
          rVar2 = rVar2 * (r2->P).a + (r2->P).b;
          rVar1 = uVar3 + 0xe000000000000001;
          if (uVar3 < 0x1fffffffffffffff) {
            rVar1 = uVar3;
          }
          lVar4 = lVar4 + -1;
        } while (lVar4 != 0);
        (r2->S).r = rVar2;
        (r2->S).count = rVar1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != local_40);
  }
  std::
  _Tuple_impl<0ul,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>>
  ::
  _Tuple_impl<std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<unsigned_long,std::allocator<unsigned_long>>&,void>
            (local_48,&local_68,&local_88);
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          *)local_48;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}